

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replicode_common.h
# Opt level: O2

P<r_exec::View> * __thiscall
core::P<r_exec::View>::operator=(P<r_exec::View> *this,P<r_exec::View> *p)

{
  P<r_exec::View> *pPVar1;
  
  pPVar1 = operator=(this,(View *)p->object);
  return pPVar1;
}

Assistant:

P<C> &operator =(const P<C> &p)
    {
        return this->operator =((C *)p.object);
    }